

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O1

void pair0_sock_init(void *arg,nni_sock *sock)

{
  nni_mtx_init((nni_mtx *)((long)arg + 8));
  nni_lmq_init((nni_lmq *)((long)arg + 0x90),0);
  nni_lmq_init((nni_lmq *)((long)arg + 0x30),0);
  nni_aio_list_init((nni_list *)((long)arg + 0xd8));
  nni_aio_list_init((nni_list *)((long)arg + 0x78));
  nni_pollable_init((nni_pollable *)((long)arg + 0x100));
  nni_pollable_init((nni_pollable *)((long)arg + 0xf0));
  *(undefined8 *)arg = 0;
  return;
}

Assistant:

static void
pair0_sock_init(void *arg, nni_sock *sock)
{
	pair0_sock *s = arg;
	NNI_ARG_UNUSED(sock);

	nni_mtx_init(&s->mtx);

	nni_lmq_init(&s->rmq, 0);
	nni_lmq_init(&s->wmq, 0);
	nni_aio_list_init(&s->raq);
	nni_aio_list_init(&s->waq);
	nni_pollable_init(&s->writable);
	nni_pollable_init(&s->readable);

	s->p = NULL;
}